

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InitTermTest.cpp
# Opt level: O2

void __thiscall
InitTermTestErrorHandler::warning(InitTermTestErrorHandler *this,SAXParseException *e)

{
  ostream *poVar1;
  XMLCh *pXVar2;
  StrX local_28;
  StrX local_20;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"\nWarning at file ");
  pXVar2 = (XMLCh *)xercesc_4_0::SAXParseException::getSystemId();
  StrX::StrX(&local_20,pXVar2);
  std::operator<<(poVar1,local_20.fLocalForm);
  poVar1 = std::operator<<(poVar1,", line ");
  xercesc_4_0::SAXParseException::getLineNumber();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", char ");
  xercesc_4_0::SAXParseException::getColumnNumber();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n  Message: ");
  pXVar2 = (XMLCh *)(**(code **)(*(long *)e + 0x10))(e);
  StrX::StrX(&local_28,pXVar2);
  std::operator<<(poVar1,local_28.fLocalForm);
  std::endl<char,std::char_traits<char>>(poVar1);
  StrX::~StrX(&local_28);
  StrX::~StrX(&local_20);
  return;
}

Assistant:

void InitTermTestErrorHandler::warning(const SAXParseException& e)
{
    std::cerr << "\nWarning at file " << StrX(e.getSystemId())
         << ", line " << e.getLineNumber()
         << ", char " << e.getColumnNumber()
         << "\n  Message: " << StrX(e.getMessage()) << std::endl;
}